

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O1

size_t __thiscall
CCharmapToLocalUcs2Little::map
          (CCharmapToLocalUcs2Little *this,wchar_t unicode_char,char **output_ptr,size_t *output_len
          )

{
  size_t sVar1;
  
  if (*output_len < 2) {
    sVar1 = 0;
  }
  else {
    **output_ptr = (char)unicode_char;
    (*output_ptr)[1] = (char)((uint)unicode_char >> 8);
    *output_ptr = *output_ptr + 2;
    sVar1 = *output_len - 2;
  }
  *output_len = sVar1;
  return 2;
}

Assistant:

size_t CCharmapToLocalUcs2Little::map(wchar_t unicode_char,
                                      char **output_ptr,
                                      size_t *output_len) const
{
    /* 
     *   If we don't have room for another byte pair, abort.  Note that we
     *   really do want to store exactly two bytes, not sizeof(anything),
     *   since we're storing to the UCS-2 file format, which encodes each
     *   character in two bytes.  
     */
    if (*output_len < 2)
    {
        *output_len = 0;
        return 2;
    }

    /*
     *   Store the little-endian 16-bit value with no translation -
     *   unicode is the same everywhere.
     *   
     *   Note that the need to perform this trivial translation for this
     *   character set is a secondary reason that this routine is virtual
     *   (the primary reason is to handle the default ASCII translation).
     *   
     *   Store the low-order 8 bits in the first byte, and the high-order
     *   8 bits in the second byte.  
     */
    **output_ptr = (unicode_char & 0xff);
    *(*output_ptr + 1) = ((unicode_char >> 8) & 0xff);

    /* skip two bytes in the output */
    *output_ptr += 2;
    *output_len -= 2;

    /* return the size of the result */
    return 2;
}